

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O1

LY_ERR lys_find_expr_atoms(lysc_node *ctx_node,lys_module *cur_mod,lyxp_expr *expr,
                          lysc_prefix *prefixes,uint32_t options,ly_set **set)

{
  uint uVar1;
  ly_ctx *ctx;
  LY_ERR LVar2;
  uint32_t options_00;
  lyd_node **pplVar3;
  long lVar4;
  char *pcVar5;
  ulong uVar6;
  lyxp_set xp_set;
  
  memset(&xp_set,0,0x90);
  if (cur_mod == (lys_module *)0x0) {
    pcVar5 = "cur_mod";
  }
  else if (expr == (lyxp_expr *)0x0) {
    pcVar5 = "expr";
  }
  else if (prefixes == (lysc_prefix *)0x0) {
    pcVar5 = "prefixes";
  }
  else {
    if (set != (ly_set **)0x0) {
      if (((ctx_node != (lysc_node *)0x0) && (ctx = ctx_node->module->ctx, ctx != (ly_ctx *)0x0)) &&
         (ctx != cur_mod->ctx && cur_mod->ctx != (ly_ctx *)0x0)) {
        ly_log(ctx,LY_LLERR,LY_EINVAL,"Different contexts mixed in a single function call.");
        return LY_EINVAL;
      }
      LVar2 = ly_set_new(set);
      if (LVar2 == LY_SUCCESS) {
        options_00 = 4;
        if ((options & 0x1c) != 0) {
          options_00 = options;
        }
        LVar2 = lyxp_atomize(cur_mod->ctx,expr,cur_mod,LY_VALUE_SCHEMA_RESOLVED,prefixes,ctx_node,
                             ctx_node,&xp_set,options_00);
        if (LVar2 == LY_SUCCESS) {
          pplVar3 = (lyd_node **)malloc((ulong)xp_set.used << 3);
          ((*set)->field_2).dnodes = pplVar3;
          if (((*set)->field_2).dnodes == (lyd_node **)0x0) {
            LVar2 = LY_EMEM;
            ly_log(cur_mod->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                   "lys_find_expr_atoms");
          }
          else {
            (*set)->size = xp_set.used;
            if (xp_set.used != 0) {
              lVar4 = 0xc;
              uVar6 = 0;
              do {
                if ((*(int *)((long)xp_set.val.nodes + lVar4 + -4) == 3) &&
                   (uVar1 = *(uint *)((long)&(xp_set.val.nodes)->node + lVar4), -1 < (int)uVar1)) {
                  if (2 < uVar1) {
                    __assert_fail("(xp_set.val.scnodes[i].in_ctx == LYXP_SET_SCNODE_ATOM_NODE) || (xp_set.val.scnodes[i].in_ctx == LYXP_SET_SCNODE_ATOM_VAL) || (xp_set.val.scnodes[i].in_ctx == LYXP_SET_SCNODE_ATOM_CTX)"
                                  ,
                                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_schema.c"
                                  ,0x208,
                                  "LY_ERR lys_find_expr_atoms(const struct lysc_node *, const struct lys_module *, const struct lyxp_expr *, const struct lysc_prefix *, uint32_t, struct ly_set **)"
                                 );
                  }
                  LVar2 = ly_set_add(*set,*(void **)((long)xp_set.val.nodes + lVar4 + -0xc),'\x01',
                                     (uint32_t *)0x0);
                  if (LVar2 != LY_SUCCESS) goto LAB_001597c6;
                }
                uVar6 = uVar6 + 1;
                lVar4 = lVar4 + 0x18;
              } while (uVar6 < xp_set.used);
            }
            LVar2 = LY_SUCCESS;
          }
        }
      }
LAB_001597c6:
      lyxp_set_free_content(&xp_set);
      if (LVar2 == LY_SUCCESS) {
        return LY_SUCCESS;
      }
      ly_set_free(*set,(_func_void_void_ptr *)0x0);
      *set = (ly_set *)0x0;
      return LVar2;
    }
    pcVar5 = "set";
  }
  ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).",pcVar5,"lys_find_expr_atoms"
        );
  return LY_EINVAL;
}

Assistant:

LIBYANG_API_DEF LY_ERR
lys_find_expr_atoms(const struct lysc_node *ctx_node, const struct lys_module *cur_mod, const struct lyxp_expr *expr,
        const struct lysc_prefix *prefixes, uint32_t options, struct ly_set **set)
{
    LY_ERR ret = LY_SUCCESS;
    struct lyxp_set xp_set = {0};
    uint32_t i;

    LY_CHECK_ARG_RET(NULL, cur_mod, expr, prefixes, set, LY_EINVAL);
    LY_CHECK_CTX_EQUAL_RET(ctx_node ? ctx_node->module->ctx : NULL, cur_mod->ctx, LY_EINVAL);
    if (!(options & LYXP_SCNODE_ALL)) {
        options = LYXP_SCNODE;
    }

    /* allocate return set */
    ret = ly_set_new(set);
    LY_CHECK_GOTO(ret, cleanup);

    /* atomize expression */
    ret = lyxp_atomize(cur_mod->ctx, expr, cur_mod, LY_VALUE_SCHEMA_RESOLVED, (void *)prefixes, ctx_node, ctx_node,
            &xp_set, options);
    LY_CHECK_GOTO(ret, cleanup);

    /* transform into ly_set */
    (*set)->objs = malloc(xp_set.used * sizeof *(*set)->objs);
    LY_CHECK_ERR_GOTO(!(*set)->objs, LOGMEM(cur_mod->ctx); ret = LY_EMEM, cleanup);
    (*set)->size = xp_set.used;

    for (i = 0; i < xp_set.used; ++i) {
        if ((xp_set.val.scnodes[i].type == LYXP_NODE_ELEM) && (xp_set.val.scnodes[i].in_ctx >= LYXP_SET_SCNODE_ATOM_NODE)) {
            assert((xp_set.val.scnodes[i].in_ctx == LYXP_SET_SCNODE_ATOM_NODE) ||
                    (xp_set.val.scnodes[i].in_ctx == LYXP_SET_SCNODE_ATOM_VAL) ||
                    (xp_set.val.scnodes[i].in_ctx == LYXP_SET_SCNODE_ATOM_CTX));
            ret = ly_set_add(*set, xp_set.val.scnodes[i].scnode, 1, NULL);
            LY_CHECK_GOTO(ret, cleanup);
        }
    }

cleanup:
    lyxp_set_free_content(&xp_set);
    if (ret) {
        ly_set_free(*set, NULL);
        *set = NULL;
    }
    return ret;
}